

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wcwidth.c
# Opt level: O1

_Bool bisearch(uint ucs,interval *table,int max)

{
  int iVar1;
  int iVar2;
  
  if ((table->first <= ucs) && (iVar2 = 0, -1 < max && ucs <= table[(uint)max].last)) {
    do {
      iVar1 = (iVar2 + max) / 2;
      if (table[iVar1].last < ucs) {
        iVar2 = iVar1 + 1;
      }
      else {
        if (table[iVar1].first <= ucs) {
          return true;
        }
        max = iVar1 + -1;
      }
    } while (iVar2 <= max);
  }
  return false;
}

Assistant:

static bool bisearch(unsigned int ucs, const struct interval *table, int max) {
  int min = 0;
  int mid;

  if (ucs < table[0].first || ucs > table[max].last)
    return false;
  while (max >= min) {
    mid = (min + max) / 2;
    if (ucs > table[mid].last)
      min = mid + 1;
    else if (ucs < table[mid].first)
      max = mid - 1;
    else
      return true;
  }

  return false;
}